

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  code *pcVar1;
  long lVar2;
  ushort uVar3;
  uint uVar4;
  MbcType MVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  long lVar11;
  int *piVar12;
  byte bVar13;
  byte *pbVar14;
  byte bVar15;
  char *pcVar16;
  byte bVar17;
  byte bVar18;
  FILE *pFVar19;
  char *fmt;
  FILE *__stream;
  char *pcVar20;
  byte *pbVar21;
  byte *pbVar22;
  char **ppcVar23;
  bool bVar24;
  bool bVar25;
  char *endptr;
  stat local_c0;
  
  nbErrors = '\0';
LAB_00101a95:
  pFVar19 = (FILE *)(ulong)(uint)argc;
  uVar4 = musl_getopt_long_only(argc,argv,"Ccf:i:jk:l:m:n:Op:r:st:Vv",longopts,(int *)0x0);
  pcVar16 = musl_optarg;
  if ((int)uVar4 < 0x56) {
    if (uVar4 == 0x43) {
switchD_00101ac8_caseD_63:
      model = (uVar4 != 99) + BOTH;
      if (0xf < titleLen) {
        main_cold_6();
      }
    }
    else {
      if (uVar4 != 0x4f) {
        if (uVar4 != 0xffffffff) goto switchD_00101ac8_caseD_57;
        if (((cartridgeType >> 8 & 0xff) == 1) && (japanese == '\x01')) {
          main_cold_7();
        }
        __stream = _stderr;
        if ((ramSize != 0x200) &&
           (pFVar19 = (FILE *)(ulong)cartridgeType, (cartridgeType & 0xff00) == ROM)) {
          if ((cartridgeType & 0xffff00fe) == ROM_RAM) {
            if (ramSize != 1) {
              main_cold_10();
            }
          }
          else if ((int)cartridgeType < 0xfd) {
            if (cartridgeType < (MBC7_SENSOR_RUMBLE_RAM_BATTERY|MBC1)) {
              if ((0x46c0d330cU >> ((ulong)cartridgeType & 0x3f) & 1) == 0) {
                if ((0x112028863U >> ((ulong)cartridgeType & 0x3f) & 1) != 0) goto LAB_00102be4;
                goto LAB_00102bc8;
              }
            }
            else {
LAB_00102bc8:
              if (cartridgeType != POCKET_CAMERA) {
LAB_00102df4:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
            }
LAB_00102b9d:
            if (ramSize == 1) {
              main_cold_8();
            }
            else if (ramSize == 0) {
              main_cold_9();
            }
          }
          else {
            if (3 < cartridgeType - MBC_NONE) {
              if (cartridgeType - HUC3 < 2) goto LAB_00102b9d;
              if (cartridgeType != BANDAI_TAMA5) goto LAB_00102df4;
            }
LAB_00102be4:
            if (ramSize != 0) {
              pcVar16 = mbcName(cartridgeType);
              fprintf(__stream,"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
                      pcVar16);
              pFVar19 = __stream;
            }
          }
        }
        if (((sgb == '\x01') && (oldLicensee != 0x33)) && (oldLicensee != 0x200)) {
          pFVar19 = _stderr;
          fprintf(_stderr,
                  "warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n");
        }
        pcVar16 = argv[musl_optind];
        if (pcVar16 == (char *)0x0) {
LAB_00102e4d:
          main_cold_11();
          switch((ulong)pFVar19 & 0xffffffff) {
          case 0:
            return 0x10622e;
          case 1:
            return 0x10624a;
          case 2:
            return 0x10624f;
          case 3:
            return 0x106258;
          case 4:
          case 7:
          case 10:
          case 0xe:
          case 0x14:
          case 0x15:
          case 0x16:
          case 0x17:
          case 0x18:
          case 0x1f:
          case 0x21:
            goto switchD_00102e67_caseD_4;
          case 5:
            return 0x106269;
          case 6:
            return 0x10626e;
          case 8:
            return 0x106232;
          case 9:
            return 0x10623a;
          case 0xb:
            return 0x10627b;
          case 0xc:
            return 0x106281;
          case 0xd:
            return 0x10628b;
          case 0xf:
            return 0x1062a2;
          case 0x10:
            return 0x1062b5;
          case 0x11:
            return 0x10629d;
          case 0x12:
            return 0x1062cc;
          case 0x13:
            return 0x1062d5;
          case 0x19:
            return 0x1062e6;
          case 0x1a:
            return 0x1062eb;
          case 0x1b:
            return 0x1062f4;
          case 0x1c:
            return 0x106305;
          case 0x1d:
            return 0x106311;
          case 0x1e:
            return 0x106321;
          case 0x20:
            return 0x106339;
          case 0x22:
            return 0x10633e;
          default:
            switch((int)pFVar19) {
            case 0xfc:
              return 0x10635d;
            case 0xfd:
              return 0x10636b;
            case 0xfe:
              return 0x106378;
            case 0xff:
              return 0x10637d;
            case 0x100:
              return 0x10638e;
            case 0x101:
              return 0x106393;
            case 0x102:
            case 0x103:
              return 0x10639f;
            case 0x104:
              return 0x1063b0;
            case 0x105:
              return 0x1063bb;
            case 0x106:
            case 0x107:
              return 0x1063cd;
            case 0x108:
              return 0x1063e4;
            case 0x109:
              return 0x1063f1;
            case 0x10a:
            case 0x10b:
              return 0x106405;
            case 0x10c:
              return 0x10641e;
            case 0x10d:
              return 0x106431;
            case 0x10e:
            case 0x10f:
              return 0x10644b;
            }
switchD_00102e67_caseD_4:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
        }
        bVar24 = nbErrors != '\0';
        ppcVar23 = argv + musl_optind;
        goto LAB_00102c41;
      }
      overwriteRom = 1;
    }
    goto LAB_00101a95;
  }
  switch(uVar4) {
  case 0x56:
    goto switchD_00101ac8_caseD_56;
  default:
switchD_00101ac8_caseD_57:
    pFVar19 = (FILE *)(ulong)uVar4;
    main_cold_12();
    goto LAB_00102e4d;
  case 99:
    goto switchD_00101ac8_caseD_63;
  case 0x66:
    fixSpec = '\0';
    do {
      bVar13 = *musl_optarg;
      if (bVar13 < 0x67) {
        if (bVar13 < 0x48) {
          if (bVar13 == 0x47) {
            if ((fixSpec & 8) != 0) {
              fwrite("warning: \'G\' overriding \'g\' in fix spec\n",0x28,1,_stderr);
            }
            fixSpec = fixSpec & 0xf3 | 4;
          }
          else {
            if (bVar13 == 0) goto LAB_00101a95;
LAB_00101c74:
            fprintf(_stderr,"warning: Ignoring \'%c\' in fix spec\n",(ulong)(uint)(int)(char)bVar13)
            ;
          }
        }
        else if (bVar13 == 0x48) {
          if ((fixSpec & 0x20) != 0) {
            fwrite("warning: \'H\' overriding \'h\' in fix spec\n",0x28,1,_stderr);
          }
          fixSpec = fixSpec & 0xcf | 0x10;
        }
        else {
          if (bVar13 != 0x4c) goto LAB_00101c74;
          if ((char)fixSpec < '\0') {
            fwrite("warning: \'L\' overriding \'l\' in fix spec\n",0x28,1,_stderr);
          }
          fixSpec = fixSpec & 0x3f | 0x40;
        }
      }
      else if (bVar13 == 0x67) {
        if ((fixSpec & 4) != 0) {
          fwrite("warning: \'g\' overriding \'G\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xf3 | 8;
      }
      else if (bVar13 == 0x68) {
        if ((fixSpec & 0x10) != 0) {
          fwrite("warning: \'h\' overriding \'H\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xcf | 0x20;
      }
      else {
        if (bVar13 != 0x6c) goto LAB_00101c74;
        if ((fixSpec & 0x40) != 0) {
          fwrite("warning: \'l\' overriding \'L\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0x3f | 0x80;
      }
      musl_optarg = musl_optarg + 1;
    } while( true );
  case 0x69:
    gameID = musl_optarg;
    sVar9 = strlen(musl_optarg);
    if (4 < sVar9) {
      fprintf(_stderr,"warning: Truncating game ID \"%s\" to 4 chars\n",pcVar16);
      sVar9 = 4;
    }
    gameIDLen = (uint8_t)sVar9;
    if (0xb < titleLen) {
      main_cold_5();
    }
    goto LAB_00101a95;
  case 0x6a:
    japanese = '\x01';
    goto LAB_00101a95;
  case 0x6b:
    newLicensee = musl_optarg;
    sVar9 = strlen(musl_optarg);
    if (2 < sVar9) {
      fprintf(_stderr,"warning: Truncating new licensee \"%s\" to 2 chars\n",pcVar16);
      sVar9 = 2;
    }
    newLicenseeLen = (uint8_t)sVar9;
    goto LAB_00101a95;
  case 0x6c:
    if (*musl_optarg == '$') {
      pcVar16 = musl_optarg + 1;
      iVar6 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar16 = "error: Argument to option \'l\' may not be empty\n";
LAB_00102593:
        report(pcVar16);
        goto LAB_00101a95;
      }
      iVar6 = 0;
    }
    pcVar16 = (char *)strtoul(pcVar16,(char **)&local_c0,iVar6);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar16 < (char *)0x100) {
        oldLicensee = (uint16_t)pcVar16;
        goto LAB_00101a95;
      }
      pcVar20 = "error: Argument to option \'l\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'l\', got %s\n";
      pcVar16 = musl_optarg;
    }
    break;
  case 0x6d:
    iVar6 = strcasecmp(musl_optarg,"help");
    if (iVar6 != 0) {
      bVar13 = *pcVar16;
      if (bVar13 == 0x24 || (byte)(bVar13 - 0x30) < 10) {
        uVar8 = strtoul(pcVar16 + (bVar13 == 0x24),(char **)&local_c0,(uint)(bVar13 == 0x24) << 4);
        cartridgeType = (MbcType)uVar8;
        if (0xff < uVar8) {
          cartridgeType = MBC_BAD_RANGE;
        }
        bVar13 = *(byte *)local_c0.st_dev;
        goto joined_r0x00101d62;
      }
      pbVar21 = (byte *)(pcVar16 + 0xd);
      pbVar22 = (byte *)(pcVar16 + 4);
      while ((bVar13 == 0x20 || (bVar13 == 9))) {
        pbVar14 = pbVar21 + -0xc;
        pbVar21 = pbVar21 + 1;
        pbVar22 = pbVar22 + 1;
        bVar13 = *pbVar14;
      }
      pbVar14 = pbVar21 + -8;
      pbVar10 = pbVar21 + -0xc;
      if (bVar13 < 0x62) {
        switch(bVar13) {
        case 0x4d:
switchD_00101f20_caseD_4d:
          pbVar22 = pbVar21 + -0xb;
          bVar13 = pbVar21[-0xc];
          if (bVar13 < 0x62) {
            if (bVar13 == 0x42) {
LAB_001024ca:
              if (((*pbVar22 | 0x20) == 99) && (pbVar21[-10] - 0x31 < 7)) {
                pbVar14 = pbVar21 + -9;
                switch((uint)pbVar21[-10]) {
                case 0x31:
                  MVar5 = MBC1;
                  break;
                case 0x32:
                  MVar5 = MBC2;
                  break;
                case 0x33:
                  MVar5 = MBC3;
                  break;
                case 0x34:
                  goto switchD_00101f20_caseD_4e;
                case 0x35:
                  MVar5 = MBC5;
                  break;
                case 0x36:
                  MVar5 = MBC6;
                  break;
                case 0x37:
                  MVar5 = MBC7_SENSOR_RUMBLE_RAM_BATTERY;
                }
                goto LAB_001025cb;
              }
            }
            else if (bVar13 == 0x4d) {
LAB_00102472:
              lVar11 = 0;
              do {
                if (lVar11 == 3) {
                  MVar5 = MMM01;
                  goto LAB_001025cb;
                }
                bVar13 = *pbVar22;
                if (bVar13 == 0) break;
                pbVar22 = pbVar22 + 1;
                bVar15 = bVar13 + 0x9f;
                bVar17 = bVar13 - 0x20;
                if (bVar13 == 0x5f) {
                  bVar13 = 0x20;
                }
                if (0x19 < bVar15) {
                  bVar17 = bVar13;
                }
                lVar2 = lVar11 + 2;
                lVar11 = lVar11 + 1;
              } while (bVar17 == "MMM01"[lVar2]);
            }
          }
          else {
            if (bVar13 == 0x62) goto LAB_001024ca;
            if (bVar13 == 0x6d) goto LAB_00102472;
          }
          break;
        case 0x4e:
        case 0x4f:
        case 0x51:
        case 0x53:
          break;
        case 0x50:
switchD_00101f20_caseD_50:
          lVar11 = 0;
          do {
            if (lVar11 == 0xc) {
              MVar5 = POCKET_CAMERA;
              pbVar14 = pbVar21;
              goto LAB_001025cb;
            }
            bVar13 = *pbVar10;
            if (bVar13 == 0) break;
            pbVar10 = pbVar10 + 1;
            bVar15 = bVar13 + 0x9f;
            bVar17 = bVar13 - 0x20;
            if (bVar13 == 0x5f) {
              bVar13 = 0x20;
            }
            if (0x19 < bVar15) {
              bVar17 = bVar13;
            }
            lVar2 = lVar11 + 1;
            lVar11 = lVar11 + 1;
          } while (bVar17 == "POCKET CAMERA"[lVar2]);
          break;
        case 0x52:
switchD_00101f20_caseD_52:
          pbVar14 = pbVar21 + -10;
          lVar11 = 0;
          do {
            if (lVar11 == 2) goto LAB_0010215d;
            bVar13 = *pbVar10;
            if (bVar13 == 0) break;
            pbVar10 = pbVar10 + 1;
            bVar15 = bVar13 + 0x9f;
            bVar17 = bVar13 - 0x20;
            if (bVar13 == 0x5f) {
              bVar13 = 0x20;
            }
            if (0x19 < bVar15) {
              bVar17 = bVar13;
            }
            lVar2 = lVar11 + 1;
            lVar11 = lVar11 + 1;
          } while (bVar17 == "ROM"[lVar2]);
          break;
        case 0x54:
switchD_00101f20_caseD_54:
          pbVar22 = pbVar21 + -0xb;
          if (pbVar21[-0xc] == 0x41) {
            lVar11 = 0;
            do {
              if (lVar11 == 3) {
                MVar5 = BANDAI_TAMA5;
                goto LAB_001025cb;
              }
              bVar13 = *pbVar22;
              if (bVar13 == 0) break;
              pbVar22 = pbVar22 + 1;
              bVar15 = bVar13 + 0x9f;
              bVar17 = bVar13 - 0x20;
              if (bVar13 == 0x5f) {
                bVar13 = 0x20;
              }
              if (0x19 < bVar15) {
                bVar17 = bVar13;
              }
              lVar2 = lVar11 + 9;
              lVar11 = lVar11 + 1;
            } while (bVar17 == "BANDAI TAMA5"[lVar2]);
          }
          else if (pbVar21[-0xc] == 0x50) {
            pbVar21 = pbVar21 + -9;
            lVar11 = 0;
            do {
              if (lVar11 == 2) goto LAB_001021e9;
              bVar13 = *pbVar22;
              if (bVar13 == 0) break;
              pbVar22 = pbVar22 + 1;
              bVar15 = bVar13 + 0x9f;
              bVar17 = bVar13 - 0x20;
              if (bVar13 == 0x5f) {
                bVar13 = 0x20;
              }
              if (0x19 < bVar15) {
                bVar17 = bVar13;
              }
              lVar2 = lVar11 + 2;
              lVar11 = lVar11 + 1;
            } while (bVar17 == "TPP1"[lVar2]);
          }
          break;
        default:
          if (bVar13 == 0x42) {
LAB_001022b4:
            lVar11 = 0;
            do {
              if (lVar11 == 0xb) {
                MVar5 = BANDAI_TAMA5;
                pbVar14 = pbVar21 + -1;
                goto LAB_001025cb;
              }
              bVar13 = *pbVar10;
              if (bVar13 == 0) break;
              pbVar10 = pbVar10 + 1;
              bVar15 = bVar13 + 0x9f;
              bVar17 = bVar13 - 0x20;
              if (bVar13 == 0x5f) {
                bVar13 = 0x20;
              }
              if (0x19 < bVar15) {
                bVar17 = bVar13;
              }
              lVar2 = lVar11 + 1;
              lVar11 = lVar11 + 1;
            } while (bVar17 == "BANDAI TAMA5"[lVar2]);
          }
          else if (bVar13 == 0x48) {
LAB_0010206a:
            lVar11 = 0;
            do {
              if (lVar11 == 2) {
                pbVar14 = pbVar21 + -9;
                if (pbVar21[-10] == 0x33) {
                  MVar5 = HUC3;
                  goto LAB_001025cb;
                }
                if (pbVar21[-10] == 0x31) {
                  MVar5 = HUC1_RAM_BATTERY;
                  goto LAB_001025cb;
                }
                break;
              }
              bVar13 = *pbVar10;
              if (bVar13 == 0) break;
              pbVar10 = pbVar10 + 1;
              bVar15 = bVar13 + 0x9f;
              bVar17 = bVar13 - 0x20;
              if (bVar13 == 0x5f) {
                bVar13 = 0x20;
              }
              if (0x19 < bVar15) {
                bVar17 = bVar13;
              }
              pbVar22 = (byte *)("UC" + lVar11);
              lVar11 = lVar11 + 1;
            } while (bVar17 == *pbVar22);
          }
        }
      }
      else {
        switch(bVar13) {
        case 0x6d:
          goto switchD_00101f20_caseD_4d;
        case 0x6e:
        case 0x6f:
        case 0x71:
        case 0x73:
          break;
        case 0x70:
          goto switchD_00101f20_caseD_50;
        case 0x72:
          goto switchD_00101f20_caseD_52;
        case 0x74:
          goto switchD_00101f20_caseD_54;
        default:
          if (bVar13 == 0x62) goto LAB_001022b4;
          if (bVar13 == 0x68) goto LAB_0010206a;
        }
      }
      goto switchD_00101f20_caseD_4e;
    }
    main_cold_4();
switchD_00101ac8_caseD_56:
    pcVar16 = get_package_version_string();
    printf("rgbfix %s\n",pcVar16);
    exit(0);
  case 0x6e:
    if (*musl_optarg == '$') {
      pcVar16 = musl_optarg + 1;
      iVar6 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar16 = "error: Argument to option \'n\' may not be empty\n";
        goto LAB_00102593;
      }
      iVar6 = 0;
    }
    pcVar16 = (char *)strtoul(pcVar16,(char **)&local_c0,iVar6);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar16 < (char *)0x100) {
        romVersion = (uint16_t)pcVar16;
        goto LAB_00101a95;
      }
      pcVar20 = "error: Argument to option \'n\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'n\', got %s\n";
      pcVar16 = musl_optarg;
    }
    break;
  case 0x70:
    if (*musl_optarg == '$') {
      pcVar16 = musl_optarg + 1;
      iVar6 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar16 = "error: Argument to option \'p\' may not be empty\n";
        goto LAB_00102593;
      }
      iVar6 = 0;
    }
    pcVar16 = (char *)strtoul(pcVar16,(char **)&local_c0,iVar6);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar16 < (char *)0x100) {
        padValue = (uint16_t)pcVar16;
        goto LAB_00101a95;
      }
      pcVar20 = "error: Argument to option \'p\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'p\', got %s\n";
      pcVar16 = musl_optarg;
    }
    break;
  case 0x72:
    if (*musl_optarg == '$') {
      pcVar16 = musl_optarg + 1;
      iVar6 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar16 = "error: Argument to option \'r\' may not be empty\n";
        goto LAB_00102593;
      }
      iVar6 = 0;
    }
    pcVar16 = (char *)strtoul(pcVar16,(char **)&local_c0,iVar6);
    if (*(byte *)local_c0.st_dev == 0) {
      if (pcVar16 < (char *)0x100) {
        ramSize = (uint16_t)pcVar16;
        goto LAB_00101a95;
      }
      pcVar20 = "error: Argument to option \'r\' is larger than 255: %lu\n";
    }
    else {
      pcVar20 = "error: Expected number as argument to option \'r\', got %s\n";
      pcVar16 = musl_optarg;
    }
    break;
  case 0x73:
    sgb = '\x01';
    goto LAB_00101a95;
  case 0x74:
    title = musl_optarg;
    sVar9 = strlen(musl_optarg);
    bVar13 = (model == DMG) + 0xf;
    if (gameID != (char *)0x0) {
      bVar13 = 0xb;
    }
    uVar8 = (ulong)bVar13;
    if (uVar8 < sVar9) {
      fprintf(_stderr,"warning: Truncating title \"%s\" to %u chars\n",pcVar16,uVar8);
      sVar9 = uVar8;
    }
    titleLen = (uint8_t)sVar9;
    goto LAB_00101a95;
  case 0x76:
    goto switchD_00101ac8_caseD_76;
  }
  report(pcVar20,pcVar16);
  goto LAB_00101a95;
switchD_00101ac8_caseD_76:
  fixSpec = 0xa8;
  goto LAB_00101a95;
LAB_001021e9:
  for (; (*pbVar21 == 0x5f || (*pbVar21 == 0x20)); pbVar21 = pbVar21 + 1) {
  }
  uVar8 = strtoul((char *)pbVar21,(char **)&local_c0,10);
  pcVar16 = "error: Failed to parse TPP1 major revision number\n";
  if ((pbVar21 == (byte *)local_c0.st_dev) ||
     (pcVar16 = "error: RGBFIX only supports TPP1 versions 1.0\n", uVar8 != 1)) {
LAB_001025a3:
    report(pcVar16);
  }
  else {
    tpp1Rev[0] = '\x01';
    bVar13 = *(byte *)local_c0.st_dev;
    if (bVar13 != 0) {
      bVar15 = bVar13 + 0x9f;
      bVar17 = bVar13 - 0x20;
      if (bVar13 == 0x5f) {
        bVar13 = 0x20;
      }
      if (0x19 < bVar15) {
        bVar17 = bVar13;
      }
      if (bVar17 == 0x2e) {
        pbVar21 = (byte *)(local_c0.st_dev + 1);
        uVar8 = strtoul((char *)pbVar21,(char **)&local_c0,10);
        pcVar16 = "error: Failed to parse TPP1 minor revision number\n";
        if (((byte *)local_c0.st_dev != pbVar21) &&
           (pcVar16 = "error: TPP1 minor revision number must be 8-bit\n", uVar8 < 0x100)) {
          tpp1Rev[1] = (uint8_t)uVar8;
          MVar5 = TPP1;
          pbVar14 = (byte *)local_c0.st_dev;
          goto LAB_001025cb;
        }
        goto LAB_001025a3;
      }
    }
  }
  goto switchD_00101f20_caseD_4e;
LAB_0010215d:
  bVar13 = *pbVar14;
  if (bVar13 < 0x4f) {
    if ((bVar13 != 9) && (bVar13 != 0x20)) goto LAB_0010259f;
  }
  else if (bVar13 != 0x5f) {
    if ((bVar13 == 0x6f) || (bVar13 == 0x4f)) {
      lVar11 = 0;
      goto LAB_00102346;
    }
LAB_0010259f:
    MVar5 = ROM;
LAB_001025cb:
    uVar8 = 0;
LAB_001025ce:
    bVar13 = (byte)uVar8;
    pbVar21 = pbVar14 + 2;
LAB_001025d3:
    bVar15 = *pbVar14;
    if (bVar15 < 0x20) {
      if (bVar15 != 9) {
        if (bVar15 != 0) goto switchD_00101f20_caseD_4e;
        if (MVar5 < MBC6) {
          if (MVar5 < MMM01) {
            if (MVar5 == ROM) {
              MVar5 = MBC2_BATTERY|MBC1;
              if (bVar13 == 0) {
                MVar5 = ROM;
                goto LAB_00102a60;
              }
            }
            else if (MVar5 != MBC1) {
              if (MVar5 == MBC2) {
                if (bVar13 == 0) {
                  MVar5 = MBC2;
                }
                else {
                  MVar5 = MBC2_BATTERY;
                  if ((uint)uVar8 != 0x40) goto LAB_00102a3a;
                }
              }
              goto LAB_00102a60;
            }
LAB_00102a12:
            uVar3 = (ushort)MVar5;
            if (bVar13 == 0) goto LAB_00102a60;
            if (bVar13 == 0xc0) {
              MVar5 = MVar5 + MBC1_RAM;
              goto LAB_00102a60;
            }
          }
          else {
            if (MVar5 == MMM01) goto LAB_00102a12;
            if (MVar5 == MBC3) {
              MVar5 = MBC3;
              if ((uVar8 & 0x20) != 0) {
                if ((uVar8 & 0x40) == 0) {
                  main_cold_2();
                }
                bVar13 = bVar13 & 0x9c;
                MVar5 = MBC3_TIMER_BATTERY;
              }
              goto LAB_00102a12;
            }
            if (MVar5 != MBC5) goto LAB_00102a60;
            bVar13 = bVar13 & 0xec;
            MVar5 = (uint)((uVar8 & 0x10) != 0) * 3 + MBC5;
            uVar3 = (ushort)MVar5;
            if ((uVar8 & 0xec) == 0) goto LAB_00102a60;
            if (bVar13 == 0xc0) {
              MVar5 = MVar5 | MBC1_RAM;
              goto LAB_00102a60;
            }
          }
          if (bVar13 == 0x80) goto code_r0x00102a2b;
        }
        else if (MVar5 < POCKET_CAMERA) {
          if (MVar5 == MBC6) goto LAB_001029d2;
          if ((MVar5 != MBC7_SENSOR_RUMBLE_RAM_BATTERY) ||
             (MVar5 = MBC7_SENSOR_RUMBLE_RAM_BATTERY, bVar13 == 0xd8)) goto LAB_00102a60;
        }
        else if (MVar5 - POCKET_CAMERA < 3) {
LAB_001029d2:
          if (bVar13 == 0) goto LAB_00102a60;
        }
        else if (MVar5 == HUC1_RAM_BATTERY) {
          MVar5 = HUC1_RAM_BATTERY;
          if (bVar13 == 0xc0) goto LAB_00102a60;
        }
        else {
          if (MVar5 != TPP1) goto LAB_00102a60;
          if ((char)bVar13 < '\0') {
            main_cold_1();
          }
          if ((uVar8 & 8) == 0) {
            MVar5 = (uint)(bVar13 >> 4 & 1) |
                    (uint)((uVar8 & 4) != 0) * 3 |
                    (uint)((byte)(uVar8 >> 3) & 4) | ((uint)uVar8 & 0x40) >> 3 | TPP1;
            goto LAB_00102a60;
          }
        }
LAB_00102a3a:
        cartridgeType = MBC_WRONG_FEATURES;
        goto LAB_00102ae8;
      }
    }
    else if ((bVar15 != 0x20) && (bVar15 != 0x5f)) goto LAB_001025fa;
    pbVar14 = pbVar14 + 1;
    pbVar21 = pbVar21 + 1;
    goto LAB_001025d3;
  }
  pbVar14 = pbVar14 + 1;
  pbVar22 = pbVar22 + 1;
  goto LAB_0010215d;
  while( true ) {
    bVar15 = bVar13 + 0x9f;
    bVar17 = bVar13 - 0x20;
    if (bVar13 == 0x5f) {
      bVar13 = 0x20;
    }
    if (0x19 < bVar15) {
      bVar17 = bVar13;
    }
    pbVar22 = pbVar22 + 1;
    pbVar21 = (byte *)("NLY" + lVar11);
    lVar11 = lVar11 + 1;
    if (bVar17 != *pbVar21) break;
LAB_00102346:
    if (lVar11 == 3) {
      MVar5 = ROM;
      pbVar14 = pbVar22;
      goto LAB_001025cb;
    }
    bVar13 = *pbVar22;
    if (bVar13 == 0) break;
  }
switchD_00101f20_caseD_4e:
  cartridgeType = MBC_BAD;
LAB_00102acd:
  pcVar16 = "error: Unknown MBC \"%s\"\nAccepted MBC names:\n";
LAB_00102ad7:
  report(pcVar16,musl_optarg);
  printAcceptedMBCNames();
  goto LAB_00101a95;
code_r0x00102a2b:
  MVar5 = uVar3 + MBC1;
LAB_00102a60:
  for (; (bVar13 = *pbVar14, bVar13 == 9 || (cartridgeType = MVar5, bVar13 == 0x20));
      pbVar14 = pbVar14 + 1) {
  }
joined_r0x00101d62:
  if (bVar13 != 0) goto switchD_00101f20_caseD_4e;
  if (cartridgeType == MBC_BAD_RANGE) {
    report("error: Specified MBC ID out of range 0-255: %s\n",musl_optarg);
    goto LAB_00101a95;
  }
  if (cartridgeType == MBC_WRONG_FEATURES) {
LAB_00102ae8:
    pcVar16 = "error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n";
    goto LAB_00102ad7;
  }
  if (cartridgeType != MBC_BAD) {
    if ((cartridgeType & ~MBC1) == ROM_RAM) {
      main_cold_3();
    }
    goto LAB_00101a95;
  }
  goto LAB_00102acd;
LAB_001025fa:
  if (bVar15 != 0x2b) goto switchD_00101f20_caseD_4e;
  for (; ((bVar15 = pbVar21[-1], bVar15 == 9 || (bVar15 == 0x5f)) || (bVar15 == 0x20));
      pbVar21 = pbVar21 + 1) {
  }
  if (0x61 < bVar15) {
    switch(bVar15) {
    case 0x6d:
      goto switchD_00102639_caseD_4d;
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_00101f20_caseD_4e;
    case 0x72:
      goto switchD_00102639_caseD_52;
    case 0x73:
      goto switchD_00102639_caseD_53;
    case 0x74:
      goto switchD_00102639_caseD_54;
    default:
      if (bVar15 != 0x62) goto switchD_00101f20_caseD_4e;
      goto LAB_001027b1;
    }
  }
  switch(bVar15) {
  case 0x4d:
switchD_00102639_caseD_4d:
    lVar11 = 0;
    while (lVar11 != 10) {
      bVar15 = pbVar21[lVar11];
      if (bVar15 == 0) goto switchD_00101f20_caseD_4e;
      bVar17 = bVar15 + 0x9f;
      bVar18 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar17) {
        bVar18 = bVar15;
      }
      lVar2 = lVar11 + 6;
      lVar11 = lVar11 + 1;
      if (bVar18 != "TPP1+MULTIRUMBLE"[lVar2]) goto switchD_00101f20_caseD_4e;
    }
    pbVar14 = pbVar21 + 10;
    bVar15 = 4;
    break;
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
    goto switchD_00101f20_caseD_4e;
  case 0x52:
switchD_00102639_caseD_52:
    pbVar14 = pbVar21 + 1;
    bVar15 = *pbVar21;
    if (bVar15 < 0x61) {
      if (bVar15 == 0x41) {
LAB_00102869:
        if ((*pbVar14 | 0x20) != 0x6d) goto switchD_00101f20_caseD_4e;
        pbVar14 = pbVar21 + 2;
        bVar15 = 0x80;
        break;
      }
      if (bVar15 != 0x55) goto switchD_00101f20_caseD_4e;
    }
    else {
      if (bVar15 == 0x61) goto LAB_00102869;
      if (bVar15 != 0x75) goto switchD_00101f20_caseD_4e;
    }
    lVar11 = 0;
    while (lVar11 != 4) {
      bVar15 = *pbVar14;
      if (bVar15 == 0) goto switchD_00101f20_caseD_4e;
      pbVar14 = pbVar14 + 1;
      bVar17 = bVar15 + 0x9f;
      bVar18 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar17) {
        bVar18 = bVar15;
      }
      lVar2 = lVar11 + 7;
      lVar11 = lVar11 + 1;
      if (bVar18 != "TPP1+RUMBLE"[lVar2]) goto switchD_00101f20_caseD_4e;
    }
    bVar15 = 0x10;
    break;
  case 0x53:
switchD_00102639_caseD_53:
    lVar11 = 0;
    while (lVar11 != 5) {
      bVar15 = pbVar21[lVar11];
      if (bVar15 == 0) goto switchD_00101f20_caseD_4e;
      bVar17 = bVar15 + 0x9f;
      bVar18 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar17) {
        bVar18 = bVar15;
      }
      pbVar22 = (byte *)("ENSOR" + lVar11);
      lVar11 = lVar11 + 1;
      if (bVar18 != *pbVar22) goto switchD_00101f20_caseD_4e;
    }
    pbVar14 = pbVar21 + 5;
    bVar15 = 8;
    break;
  case 0x54:
switchD_00102639_caseD_54:
    lVar11 = 0;
    while (lVar11 != 4) {
      bVar15 = pbVar21[lVar11];
      if (bVar15 == 0) goto switchD_00101f20_caseD_4e;
      bVar17 = bVar15 + 0x9f;
      bVar18 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar17) {
        bVar18 = bVar15;
      }
      lVar2 = lVar11 + 6;
      lVar11 = lVar11 + 1;
      if (bVar18 != "TPP1+TIMER"[lVar2]) goto switchD_00101f20_caseD_4e;
    }
    pbVar14 = pbVar21 + 4;
    bVar15 = 0x20;
    break;
  default:
    if (bVar15 != 0x42) goto switchD_00101f20_caseD_4e;
LAB_001027b1:
    lVar11 = 0;
    while (lVar11 != 6) {
      bVar15 = pbVar21[lVar11];
      if (bVar15 == 0) goto switchD_00101f20_caseD_4e;
      bVar17 = bVar15 + 0x9f;
      bVar18 = bVar15 - 0x20;
      if (bVar15 == 0x5f) {
        bVar15 = 0x20;
      }
      if (0x19 < bVar17) {
        bVar18 = bVar15;
      }
      lVar2 = lVar11 + 6;
      lVar11 = lVar11 + 1;
      if (bVar18 != "TPP1+BATTERY"[lVar2]) goto switchD_00101f20_caseD_4e;
    }
    pbVar14 = pbVar21 + 6;
    bVar15 = 0x40;
  }
  uVar8 = (ulong)(bVar13 | bVar15);
  goto LAB_001025ce;
LAB_00102c41:
  ppcVar23 = ppcVar23 + 1;
  nbErrors = '\0';
  if ((*pcVar16 == '-') && (pcVar16[1] == '\0')) {
    pcVar16 = "<stdin>";
    processFile(0,1,"<stdin>",0);
  }
  else {
    iVar6 = open(pcVar16,2);
    if (iVar6 == -1) {
      piVar12 = __errno_location();
      pcVar20 = strerror(*piVar12);
      report("FATAL: Failed to open \"%s\" for reading+writing: %s\n",pcVar16,pcVar20);
    }
    else {
      iVar7 = fstat(iVar6,&local_c0);
      if (iVar7 == -1) {
        piVar12 = __errno_location();
        pcVar20 = strerror(*piVar12);
        fmt = "FATAL: Failed to stat \"%s\": %s\n";
LAB_00102d9d:
        report(fmt,pcVar16,pcVar20);
      }
      else if ((local_c0.st_mode & 0xf000) == 0x8000) {
        if (local_c0.st_size < 0x150) {
          fmt = "FATAL: \"%s\" too short, expected at least 336 ($150) bytes, got only %jd\n";
          pcVar20 = (char *)local_c0.st_size;
          goto LAB_00102d9d;
        }
        processFile(iVar6,iVar6,pcVar16,local_c0.st_size);
      }
      else {
        report("FATAL: \"%s\" is not a regular file, and thus cannot be modified in-place\n",pcVar16
              );
      }
      close(iVar6);
    }
  }
  uVar4 = (uint)nbErrors;
  if (uVar4 == 0) {
    bVar25 = false;
  }
  else {
    pcVar20 = "s";
    if (uVar4 == 1) {
      pcVar20 = "";
    }
    fprintf(_stderr,"Fixing \"%s\" failed with %u error%s\n",pcVar16,(ulong)uVar4,pcVar20);
    bVar25 = nbErrors != '\0';
  }
  bVar24 = (bool)(bVar24 | bVar25);
  pcVar16 = *ppcVar23;
  if (pcVar16 == (char *)0x0) {
    return (uint)bVar24;
  }
  goto LAB_00102c41;
}

Assistant:

int main(int argc, char *argv[])
{
	nbErrors = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			size_t len;
#define parseByte(output, name) \
do { \
	char *endptr; \
	unsigned long tmp; \
	\
	if (musl_optarg[0] == 0) { \
		report("error: Argument to option '" name "' may not be empty\n"); \
	} else { \
		if (musl_optarg[0] == '$') { \
			tmp = strtoul(&musl_optarg[1], &endptr, 16); \
		} else { \
			tmp = strtoul(musl_optarg, &endptr, 0); \
		} \
		if (*endptr) \
			report("error: Expected number as argument to option '" name "', got %s\n", \
			       musl_optarg); \
		else if (tmp > 0xFF) \
			report("error: Argument to option '" name "' is larger than 255: %lu\n", tmp); \
		else \
			output = tmp; \
	} \
} while (0)

		case 'C':
		case 'c':
			model = ch == 'c' ? BOTH : CGB;
			if (titleLen > 15) {
				titleLen = 15;
				fprintf(stderr, "warning: Truncating title \"%s\" to 15 chars\n",
					title);
			}
			break;

		case 'f':
			fixSpec = 0;
			while (*musl_optarg) {
				switch (*musl_optarg) {
#define SPEC_l FIX_LOGO
#define SPEC_L TRASH_LOGO
#define SPEC_h FIX_HEADER_SUM
#define SPEC_H TRASH_HEADER_SUM
#define SPEC_g FIX_GLOBAL_SUM
#define SPEC_G TRASH_GLOBAL_SUM
#define overrideSpec(cur, bad) \
do { \
	if (fixSpec & SPEC_##bad) \
		fprintf(stderr, \
			"warning: '" #cur "' overriding '" #bad "' in fix spec\n"); \
	fixSpec = (fixSpec & ~SPEC_##bad) | SPEC_##cur; \
} while (0)
				case 'l':
					overrideSpec(l, L);
					break;
				case 'L':
					overrideSpec(L, l);
					break;

				case 'h':
					overrideSpec(h, H);
					break;
				case 'H':
					overrideSpec(H, h);
					break;

				case 'g':
					overrideSpec(g, G);
					break;
				case 'G':
					overrideSpec(G, g);
					break;

				default:
					fprintf(stderr, "warning: Ignoring '%c' in fix spec\n",
						*musl_optarg);
#undef overrideSpec
				}
				musl_optarg++;
			}
			break;

		case 'i':
			gameID = musl_optarg;
			len = strlen(gameID);
			if (len > 4) {
				len = 4;
				fprintf(stderr, "warning: Truncating game ID \"%s\" to 4 chars\n",
					gameID);
			}
			gameIDLen = len;
			if (titleLen > 11) {
				titleLen = 11;
				fprintf(stderr, "warning: Truncating title \"%s\" to 11 chars\n",
					title);
			}
			break;

		case 'j':
			japanese = false;
			break;

		case 'k':
			newLicensee = musl_optarg;
			len = strlen(newLicensee);
			if (len > 2) {
				len = 2;
				fprintf(stderr,
					"warning: Truncating new licensee \"%s\" to 2 chars\n",
					newLicensee);
			}
			newLicenseeLen = len;
			break;

		case 'l':
			parseByte(oldLicensee, "l");
			break;

		case 'm':
			cartridgeType = parseMBC(musl_optarg);
			if (cartridgeType == MBC_BAD) {
				report("error: Unknown MBC \"%s\"\nAccepted MBC names:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_WRONG_FEATURES) {
				report("error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_BAD_RANGE) {
				report("error: Specified MBC ID out of range 0-255: %s\n",
				       musl_optarg);
			} else if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
				fprintf(stderr, "warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n");
			}
			break;

		case 'n':
			parseByte(romVersion, "n");
			break;

		case 'O':
			overwriteRom = true;
			break;

		case 'p':
			parseByte(padValue, "p");
			break;

		case 'r':
			parseByte(ramSize, "r");
			break;

		case 's':
			sgb = true;
			break;

		case 't': {
			title = musl_optarg;
			len = strlen(title);
			uint8_t maxLen = maxTitleLen();

			if (len > maxLen) {
				len = maxLen;
				fprintf(stderr, "warning: Truncating title \"%s\" to %u chars\n",
					title, maxLen);
			}
			titleLen = len;
			break;
		}

		case 'V':
			printf("rgbfix %s\n", get_package_version_string());
			exit(0);

		case 'v':
			fixSpec = FIX_LOGO | FIX_HEADER_SUM | FIX_GLOBAL_SUM;
			break;

		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
#undef parseByte
	}

	if ((cartridgeType & 0xFF00) == TPP1 && !japanese)
		fprintf(stderr, "warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n");

	// Check that RAM size is correct for "standard" mappers
	if (ramSize != UNSPECIFIED && (cartridgeType & 0xFF00) == 0) {
		if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
			if (ramSize != 1)
				fprintf(stderr, "warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n",
					mbcName(cartridgeType));
		} else if (hasRAM(cartridgeType)) {
			if (!ramSize) {
				fprintf(stderr,
					"warning: MBC \"%s\" has RAM, but RAM size was set to 0\n",
					mbcName(cartridgeType));
			} else if (ramSize == 1) {
				fprintf(stderr,
					"warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n",
					mbcName(cartridgeType));
			} // TODO: check possible values?
		} else if (ramSize) {
			fprintf(stderr,
				"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
				mbcName(cartridgeType), ramSize);
		}
	}

	if (sgb && oldLicensee != UNSPECIFIED && oldLicensee != 0x33)
		fprintf(stderr,
			"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n",
			oldLicensee);

	argv += musl_optind;
	bool failed = nbErrors;

	if (!*argv) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",
		      stderr);
		printUsage();
		exit(1);
	}

	do {
		failed |= processFilename(*argv);
	} while (*++argv);

	return failed;
}